

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apdu.c
# Opt level: O1

size_t apduRespDec(apdu_resp_t *resp,octet *apdu,size_t count)

{
  size_t sVar1;
  
  sVar1 = 0xffffffffffffffff;
  if (1 < count) {
    if (resp != (apdu_resp_t *)0x0) {
      memSet(resp,'\0',0x10);
      resp->sw1 = apdu[count - 2];
      resp->sw2 = apdu[count - 1];
      resp->rdf_len = count - 2;
      memCopy(resp + 1,apdu,count - 2);
    }
    sVar1 = count + 0xe;
  }
  return sVar1;
}

Assistant:

size_t apduRespDec(apdu_resp_t* resp, const octet apdu[], size_t count)
{
	// pre
	ASSERT(memIsValid(apdu, count));
	ASSERT(memIsNullOrValid(resp, sizeof(apdu_resp_t)));
	// декодировать
	if (count < 2)
		return SIZE_MAX;
	if (resp)
	{
		memSetZero(resp, sizeof(apdu_resp_t));
		resp->sw1 = apdu[count - 2], resp->sw2 = apdu[count - 1];
		resp->rdf_len = count - 2;
		memCopy(resp->rdf, apdu, resp->rdf_len);
	}
	// возвратить размер resp
	return sizeof(apdu_resp_t) + count - 2;
}